

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

int memCmpRev_fast(void *buf1,void *buf2,size_t count)

{
  byte *pbVar1;
  byte *pbVar2;
  octet *b2;
  octet *b1;
  size_t count_local;
  void *buf2_local;
  void *buf1_local;
  
  b2 = (octet *)((long)buf2 + count);
  b1 = (octet *)((long)buf1 + count);
  count_local = count;
  while( true ) {
    if (count_local == 0) {
      return 0;
    }
    pbVar1 = b1 + -1;
    pbVar2 = b2 + -1;
    if (b2[-1] < b1[-1]) break;
    b2 = pbVar2;
    b1 = pbVar1;
    count_local = count_local - 1;
    if (*pbVar1 < *pbVar2) {
      return -1;
    }
  }
  return 1;
}

Assistant:

int FAST(memCmpRev)(const void* buf1, const void* buf2, size_t count)
{
	const octet* b1 = (const octet*)buf1 + count;
	const octet* b2 = (const octet*)buf2 + count;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	while (count--)
		if (*--b1 > *--b2)
			return 1;
		else if (*b1 < *b2)
			return -1;
	return 0;
}